

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool CountHighbitsCollisions<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,int nbHBits)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  byte bVar4;
  uint in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar5;
  uint h2;
  uint h1;
  size_t hnb;
  int collcount;
  double expected;
  size_t nbH;
  int shiftBy;
  int origBits;
  ulong local_40;
  uint local_34;
  undefined8 in_stack_ffffffffffffffd0;
  bool local_1;
  
  if ((int)(0x20 - in_ESI) < 1) {
    local_1 = true;
  }
  else {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    dVar5 = EstimateNbCollisions
                      ((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                       (int)in_stack_ffffffffffffffd0);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",dVar5,(ulong)in_ESI);
    local_34 = 0;
    for (local_40 = 1; local_40 < sVar2; local_40 = local_40 + 1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,local_40 - 1);
      uVar1 = *pvVar3;
      bVar4 = (byte)(0x20 - in_ESI);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_40)
      ;
      if (uVar1 >> (bVar4 & 0x1f) == *pvVar3 >> (bVar4 & 0x1f)) {
        local_34 = local_34 + 1;
      }
    }
    printf("actual %6i (%.2fx)",(double)(int)local_34 / dVar5,(ulong)local_34);
    if ((0.98 < (double)(int)local_34 / dVar5) && (local_34 != (int)dVar5)) {
      printf(" (%i)",(ulong)(local_34 - (int)dVar5));
    }
    if ((double)(int)local_34 / dVar5 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}